

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall
slang::ast::Compilation::createDefinition
          (Compilation *this,Scope *scope,LookupLocation location,ModuleDeclarationSyntax *syntax)

{
  NetType **ppNVar1;
  flat_hash_map<const_syntax::SyntaxNode_*,_SyntaxMetadata> *arrays_;
  size_t *psVar2;
  flat_hash_map<const_syntax::ModuleDeclarationSyntax_*,_std::vector<DefinitionSymbol_*>_>
  *arrays__00;
  group_type_pointer pgVar3;
  group_type_pointer pgVar4;
  undefined4 uVar5;
  ulong uVar6;
  value_type_pointer ppVar7;
  iterator __position;
  RootSymbol *pRVar8;
  uint uVar9;
  int iVar10;
  undefined1 auVar11 [16];
  _Optional_payload_base<slang::TimeScale> timeScale;
  byte bVar12;
  Scope *pSVar13;
  ulong uVar14;
  NetType *defaultNetType;
  DefinitionSymbol *pDVar15;
  reference pvVar16;
  uint uVar17;
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  ulong hash;
  value_type_pointer ppVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  byte bVar27;
  SourceRange sourceRange;
  LookupLocation lookupLocation;
  try_emplace_args_t local_b1;
  pointer def;
  ModuleDeclarationSyntax *local_a8;
  Scope *local_a0;
  uint32_t local_94;
  ulong local_90;
  locator res;
  
  lookupLocation.scope = location.scope;
  local_94 = location.index;
  arrays_ = &this->syntaxMetadata;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = syntax;
  hash = SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar14 = hash >> ((byte)(this->syntaxMetadata).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
                          .arrays.groups_size_index & 0x3f);
  uVar5 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[hash & 0xff];
  ppVar21 = (this->syntaxMetadata).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
            .arrays.elements_;
  local_90 = (ulong)((uint)hash & 7);
  uVar6 = (this->syntaxMetadata).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
          .arrays.groups_size_mask;
  uVar18 = 0;
  uVar20 = uVar14;
  do {
    pgVar3 = (this->syntaxMetadata).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
             .arrays.groups_ + uVar20;
    bVar12 = pgVar3->m[0xf].n;
    uVar24 = (uchar)uVar5;
    auVar22[0] = -(pgVar3->m[0].n == uVar24);
    uVar25 = (uchar)((uint)uVar5 >> 8);
    auVar22[1] = -(pgVar3->m[1].n == uVar25);
    uVar26 = (uchar)((uint)uVar5 >> 0x10);
    auVar22[2] = -(pgVar3->m[2].n == uVar26);
    bVar27 = (byte)((uint)uVar5 >> 0x18);
    auVar22[3] = -(pgVar3->m[3].n == bVar27);
    auVar22[4] = -(pgVar3->m[4].n == uVar24);
    auVar22[5] = -(pgVar3->m[5].n == uVar25);
    auVar22[6] = -(pgVar3->m[6].n == uVar26);
    auVar22[7] = -(pgVar3->m[7].n == bVar27);
    auVar22[8] = -(pgVar3->m[8].n == uVar24);
    auVar22[9] = -(pgVar3->m[9].n == uVar25);
    auVar22[10] = -(pgVar3->m[10].n == uVar26);
    auVar22[0xb] = -(pgVar3->m[0xb].n == bVar27);
    auVar22[0xc] = -(pgVar3->m[0xc].n == uVar24);
    auVar22[0xd] = -(pgVar3->m[0xd].n == uVar25);
    auVar22[0xe] = -(pgVar3->m[0xe].n == uVar26);
    auVar22[0xf] = -(bVar12 == bVar27);
    for (uVar17 = (uint)(ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe);
        def = (pointer)syntax, local_a0 = scope, uVar17 != 0; uVar17 = uVar17 - 1 & uVar17) {
      uVar9 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> uVar9 & 1) == 0; uVar9 = uVar9 + 1) {
        }
      }
      if ((ModuleDeclarationSyntax *)ppVar21[uVar20 * 0xf + (ulong)uVar9].first == syntax) {
        ppVar21 = ppVar21 + uVar20 * 0xf + (ulong)uVar9;
        goto LAB_0028a4b3;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[local_90] & bVar12) == 0) break;
    lVar19 = uVar20 + uVar18;
    uVar18 = uVar18 + 1;
    uVar20 = lVar19 + 1U & uVar6;
  } while (uVar18 <= uVar6);
  if ((this->syntaxMetadata).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
      .size_ctrl.size <
      (this->syntaxMetadata).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                     *)arrays_,(arrays_type *)arrays_,uVar14,hash,(try_emplace_args_t *)&local_a8,
               (SyntaxNode **)&def);
    psVar2 = &(this->syntaxMetadata).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::ast::Compilation::SyntaxMetadata>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>_>_>
              .size_ctrl.size;
    *psVar2 = *psVar2 + 1;
    ppVar21 = res.p;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              (&res,(table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::ast::Compilation::SyntaxMetadata>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::ast::Compilation::SyntaxMetadata>>>
                     *)arrays_,hash,(try_emplace_args_t *)&local_a8,(SyntaxNode **)&def);
    ppVar21 = res.p;
  }
LAB_0028a4b3:
  defaultNetType = (ppVar21->second).defaultNetType;
  if (defaultNetType == (NetType *)0x0) {
    defaultNetType = Scope::getDefaultNetType(local_a0);
    (ppVar21->second).defaultNetType = defaultNetType;
  }
  pDVar15 = (DefinitionSymbol *)operator_new(0x2e8);
  lookupLocation.index = local_94;
  lookupLocation._12_4_ = 0;
  DefinitionSymbol::DefinitionSymbol
            (pDVar15,local_a0,lookupLocation,syntax,defaultNetType,
             (ppVar21->second).unconnectedDrive,(ppVar21->second).cellDefine,
             (optional<slang::TimeScale>)
             (ppVar21->second).timeScale.super__Optional_base<slang::TimeScale,_true,_true>.
             _M_payload.super__Optional_payload_base<slang::TimeScale>,(ppVar21->second).tree);
  res.pg = (group15<boost::unordered::detail::foa::plain_integral> *)pDVar15;
  pvVar16 = std::
            vector<std::unique_ptr<slang::ast::DefinitionSymbol,std::default_delete<slang::ast::DefinitionSymbol>>,std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,std::default_delete<slang::ast::DefinitionSymbol>>>>
            ::
            emplace_back<std::unique_ptr<slang::ast::DefinitionSymbol,std::default_delete<slang::ast::DefinitionSymbol>>>
                      ((vector<std::unique_ptr<slang::ast::DefinitionSymbol,std::default_delete<slang::ast::DefinitionSymbol>>,std::allocator<std::unique_ptr<slang::ast::DefinitionSymbol,std::default_delete<slang::ast::DefinitionSymbol>>>>
                        *)&this->definitionMemory,
                       (unique_ptr<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>
                        *)&res);
  pDVar15 = (pvVar16->_M_t).
            super___uniq_ptr_impl<slang::ast::DefinitionSymbol,_std::default_delete<slang::ast::DefinitionSymbol>_>
            ._M_t.
            super__Tuple_impl<0UL,_slang::ast::DefinitionSymbol_*,_std::default_delete<slang::ast::DefinitionSymbol>_>
            .super__Head_base<0UL,_slang::ast::DefinitionSymbol_*,_false>._M_head_impl;
  if (res.pg != (group15<boost::unordered::detail::foa::plain_integral> *)0x0) {
    std::default_delete<slang::ast::DefinitionSymbol>::operator()
              ((default_delete<slang::ast::DefinitionSymbol> *)&res,(DefinitionSymbol *)res.pg);
  }
  arrays__00 = &this->definitionFromSyntax;
  uVar14 = hash >> ((byte)(this->definitionFromSyntax).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
                          .arrays.groups_size_index & 0x3f);
  ppVar7 = (this->definitionFromSyntax).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
           .arrays.elements_;
  uVar6 = (this->definitionFromSyntax).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
          .arrays.groups_size_mask;
  uVar18 = 0;
  uVar20 = uVar14;
  do {
    pgVar4 = (this->definitionFromSyntax).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
             .arrays.groups_ + uVar20;
    bVar12 = pgVar4->m[0xf].n;
    auVar23[0] = -(pgVar4->m[0].n == uVar24);
    auVar23[1] = -(pgVar4->m[1].n == uVar25);
    auVar23[2] = -(pgVar4->m[2].n == uVar26);
    auVar23[3] = -(pgVar4->m[3].n == bVar27);
    auVar23[4] = -(pgVar4->m[4].n == uVar24);
    auVar23[5] = -(pgVar4->m[5].n == uVar25);
    auVar23[6] = -(pgVar4->m[6].n == uVar26);
    auVar23[7] = -(pgVar4->m[7].n == bVar27);
    auVar23[8] = -(pgVar4->m[8].n == uVar24);
    auVar23[9] = -(pgVar4->m[9].n == uVar25);
    auVar23[10] = -(pgVar4->m[10].n == uVar26);
    auVar23[0xb] = -(pgVar4->m[0xb].n == bVar27);
    auVar23[0xc] = -(pgVar4->m[0xc].n == uVar24);
    auVar23[0xd] = -(pgVar4->m[0xd].n == uVar25);
    auVar23[0xe] = -(pgVar4->m[0xe].n == uVar26);
    auVar23[0xf] = -(bVar12 == bVar27);
    for (uVar17 = (uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe); def = pDVar15,
        local_a8 = syntax, uVar17 != 0; uVar17 = uVar17 - 1 & uVar17) {
      iVar10 = 0;
      if (uVar17 != 0) {
        for (; (uVar17 >> iVar10 & 1) == 0; iVar10 = iVar10 + 1) {
        }
      }
      if (*(ModuleDeclarationSyntax **)
           ((long)&ppVar7[uVar20 * 0xf].first + (ulong)(uint)(iVar10 << 5)) == syntax) {
        res.p = (pair<const_slang::syntax::SyntaxNode_*const,_slang::ast::Compilation::SyntaxMetadata>
                 *)((long)&ppVar7[uVar20 * 0xf].first + (ulong)(uint)(iVar10 << 5));
        goto LAB_0028a649;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[local_90] & bVar12) == 0) break;
    lVar19 = uVar20 + uVar18;
    uVar18 = uVar18 + 1;
    uVar20 = lVar19 + 1U & uVar6;
  } while (uVar18 <= uVar6);
  if ((this->definitionFromSyntax).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
      .size_ctrl.size <
      (this->definitionFromSyntax).table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::ModuleDeclarationSyntax_const*,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::ModuleDeclarationSyntax_const*,void>,std::equal_to<slang::syntax::ModuleDeclarationSyntax_const*>,std::allocator<std::pair<slang::syntax::ModuleDeclarationSyntax_const*const,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>>>
    ::
    nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::ModuleDeclarationSyntax_const*>
              ((locator *)&res,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::ModuleDeclarationSyntax_const*,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::ModuleDeclarationSyntax_const*,void>,std::equal_to<slang::syntax::ModuleDeclarationSyntax_const*>,std::allocator<std::pair<slang::syntax::ModuleDeclarationSyntax_const*const,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>>>
                *)arrays__00,(arrays_type *)arrays__00,uVar14,hash,&local_b1,&local_a8);
    psVar2 = &(this->definitionFromSyntax).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::ModuleDeclarationSyntax_*,_std::vector<slang::ast::DefinitionSymbol_*>_>,_slang::hash<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::equal_to<const_slang::syntax::ModuleDeclarationSyntax_*>,_std::allocator<std::pair<const_slang::syntax::ModuleDeclarationSyntax_*const,_std::vector<slang::ast::DefinitionSymbol_*>_>_>_>
              .size_ctrl.size;
    *psVar2 = *psVar2 + 1;
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::ModuleDeclarationSyntax_const*,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::ModuleDeclarationSyntax_const*,void>,std::equal_to<slang::syntax::ModuleDeclarationSyntax_const*>,std::allocator<std::pair<slang::syntax::ModuleDeclarationSyntax_const*const,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::ModuleDeclarationSyntax_const*>
              ((locator *)&res,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::ModuleDeclarationSyntax_const*,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::ModuleDeclarationSyntax_const*,void>,std::equal_to<slang::syntax::ModuleDeclarationSyntax_const*>,std::allocator<std::pair<slang::syntax::ModuleDeclarationSyntax_const*const,std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>>>>
                *)arrays__00,hash,&local_b1,&local_a8);
  }
LAB_0028a649:
  __position._M_current = (DefinitionSymbol **)((res.p)->second).defaultNetType;
  if (__position._M_current == *(DefinitionSymbol ***)&((res.p)->second).timeScale) {
    std::vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>::
    _M_realloc_insert<slang::ast::DefinitionSymbol*const&>
              ((vector<slang::ast::DefinitionSymbol*,std::allocator<slang::ast::DefinitionSymbol*>>
                *)&(res.p)->second,__position,&def);
    pDVar15 = def;
  }
  else {
    *__position._M_current = pDVar15;
    ppNVar1 = &((res.p)->second).defaultNetType;
    *ppNVar1 = (NetType *)&((*ppNVar1)->super_Symbol).name;
  }
  pSVar13 = local_a0;
  insertDefinition(this,&pDVar15->super_Symbol,local_a0);
  pRVar8 = (this->root)._M_t.
           super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
           ._M_t.
           super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
           .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>._M_head_impl;
  if ((pSVar13->thisSym->kind == CompilationUnit) ||
     (pRVar8 != (RootSymbol *)0x0 && &pRVar8->super_Scope == pSVar13)) {
    timeScale = (def->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
                super__Optional_payload_base<slang::TimeScale>;
    sourceRange = parsing::Token::range(&((syntax->header).ptr)->name);
    checkElemTimeScale(this,(optional<slang::TimeScale>)timeScale,sourceRange);
  }
  return;
}

Assistant:

void Compilation::createDefinition(const Scope& scope, LookupLocation location,
                                   const ModuleDeclarationSyntax& syntax) {
    SLANG_ASSERT(!isFrozen());

    // We can only be missing metadata if the definition is created programmatically
    // (i.e. not via the parser) so we just fill in the parent's default net type
    // so that it's not a null pointer.
    auto& metadata = syntaxMetadata[&syntax];
    if (!metadata.defaultNetType)
        metadata.defaultNetType = &scope.getDefaultNetType();

    auto def = definitionMemory
                   .emplace_back(std::make_unique<DefinitionSymbol>(
                       scope, location, syntax, *metadata.defaultNetType, metadata.unconnectedDrive,
                       metadata.cellDefine, metadata.timeScale, metadata.tree))
                   .get();
    definitionFromSyntax[&syntax].push_back(def);

    insertDefinition(*def, scope);

    auto targetScope = scope.asSymbol().kind == SymbolKind::CompilationUnit ? root.get() : &scope;
    const bool isRoot = targetScope == root.get();
    if (isRoot)
        checkElemTimeScale(def->timeScale, syntax.header->name.range());
}